

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SliderInt(char *label,int *v,int v_min,int v_max,char *display_format)

{
  bool bVar1;
  char *display_format_00;
  float v_f;
  float local_14;
  
  display_format_00 = "%.0f";
  if (display_format != (char *)0x0) {
    display_format_00 = display_format;
  }
  local_14 = (float)*v;
  bVar1 = SliderFloat(label,&local_14,(float)v_min,(float)v_max,display_format_00,1.0);
  *v = (int)local_14;
  return bVar1;
}

Assistant:

bool ImGui::SliderInt(const char* label, int* v, int v_min, int v_max, const char* display_format)
{
    if (!display_format)
        display_format = "%.0f";
    float v_f = (float)*v;
    bool value_changed = SliderFloat(label, &v_f, (float)v_min, (float)v_max, display_format, 1.0f);
    *v = (int)v_f;
    return value_changed;
}